

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void DockSettingsHandler_DockNodeToSettings(ImGuiDockContext *dc,ImGuiDockNode *node,int depth)

{
  int *piVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImGuiID IVar8;
  ImGuiID IVar9;
  uint uVar10;
  ImGuiWindow_conflict *pIVar11;
  ImGuiDockNodeSettings *pIVar12;
  int iVar13;
  int iVar14;
  ImGuiDockNodeSettings *__dest;
  ImGuiID IVar15;
  ImGuiID IVar16;
  undefined1 uVar17;
  int iVar18;
  undefined4 uVar19;
  ulong uVar20;
  undefined4 uVar21;
  
  if (depth < 0x100) {
    do {
      IVar15 = 0;
      IVar16 = 0;
      if (node->ParentNode != (ImGuiDockNode *)0x0) {
        IVar16 = node->ParentNode->ID;
      }
      if ((((node->MergedFlags & 0x400) != 0) && (node->HostWindow != (ImGuiWindow_conflict *)0x0))
         && (pIVar11 = node->HostWindow->ParentWindow, pIVar11 != (ImGuiWindow_conflict *)0x0)) {
        IVar15 = pIVar11->ID;
      }
      if (node->ChildNodes[0] == (ImGuiDockNode *)0x0) {
        uVar17 = 0xff;
      }
      else {
        uVar17 = (undefined1)node->SplitAxis;
      }
      IVar8 = node->ID;
      IVar9 = node->SelectedTabId;
      uVar10 = node->LocalFlags;
      fVar2 = (node->Pos).x;
      fVar3 = (node->Pos).y;
      fVar4 = (node->SizeRef).x;
      fVar5 = (node->Size).x;
      fVar6 = (node->SizeRef).y;
      fVar7 = (node->Size).y;
      iVar18 = (dc->NodesSettings).Size;
      if (iVar18 == (dc->NodesSettings).Capacity) {
        if (iVar18 == 0) {
          iVar14 = 8;
        }
        else {
          iVar14 = iVar18 / 2 + iVar18;
        }
        iVar13 = iVar18 + 1;
        if (iVar18 + 1 < iVar14) {
          iVar13 = iVar14;
        }
        if (GImGui != (ImGuiContext_conflict1 *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImGuiDockNodeSettings *)
                 (*GImAllocatorAllocFunc)((long)iVar13 * 0x24,GImAllocatorUserData);
        pIVar12 = (dc->NodesSettings).Data;
        if (pIVar12 != (ImGuiDockNodeSettings *)0x0) {
          memcpy(__dest,pIVar12,(long)(dc->NodesSettings).Size * 0x24);
          pIVar12 = (dc->NodesSettings).Data;
          if ((pIVar12 != (ImGuiDockNodeSettings *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)
             ) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar12,GImAllocatorUserData);
        }
        (dc->NodesSettings).Data = __dest;
        (dc->NodesSettings).Capacity = iVar13;
        iVar18 = (dc->NodesSettings).Size;
      }
      else {
        __dest = (dc->NodesSettings).Data;
      }
      uVar20 = CONCAT44((int)fVar7 << 0x10,(int)fVar3 << 0x10) |
               CONCAT44((int)fVar5,(int)fVar2) & (ulong)DAT_0020f6b0;
      __dest[iVar18].ID = IVar8;
      __dest[iVar18].ParentNodeId = IVar16;
      __dest[iVar18].ParentWindowId = IVar15;
      __dest[iVar18].SelectedTabId = IVar9;
      __dest[iVar18].SplitAxis = uVar17;
      __dest[iVar18].Depth = (char)depth;
      *(undefined2 *)&__dest[iVar18].field_0x12 = 0;
      __dest[iVar18].Flags = uVar10 & 0xc1fc20;
      pIVar12 = __dest + iVar18;
      uVar19 = (undefined4)uVar20;
      uVar21 = (undefined4)(uVar20 >> 0x20);
      (pIVar12->Pos).x = (short)uVar19;
      (pIVar12->Pos).y = (short)((uint)uVar19 >> 0x10);
      (pIVar12->Size).x = (short)uVar21;
      (pIVar12->Size).y = (short)((uint)uVar21 >> 0x10);
      __dest[iVar18].SizeRef = (ImVec2ih)((int)fVar4 & 0xffffU | (int)fVar6 << 0x10);
      (dc->NodesSettings).Size = (dc->NodesSettings).Size + 1;
      if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
        DockSettingsHandler_DockNodeToSettings(dc,node->ChildNodes[0],depth + 1);
      }
      node = node->ChildNodes[1];
      if (node == (ImGuiDockNode *)0x0) {
        return;
      }
      depth = depth + 1;
    } while (depth != 0x100);
  }
  __assert_fail("depth < (1 << (sizeof(node_settings.Depth) << 3))",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x3faf,
                "void DockSettingsHandler_DockNodeToSettings(ImGuiDockContext *, ImGuiDockNode *, int)"
               );
}

Assistant:

static void DockSettingsHandler_DockNodeToSettings(ImGuiDockContext* dc, ImGuiDockNode* node, int depth)
{
    ImGuiDockNodeSettings node_settings;
    IM_ASSERT(depth < (1 << (sizeof(node_settings.Depth) << 3)));
    node_settings.ID = node->ID;
    node_settings.ParentNodeId = node->ParentNode ? node->ParentNode->ID : 0;
    node_settings.ParentWindowId = (node->IsDockSpace() && node->HostWindow && node->HostWindow->ParentWindow) ? node->HostWindow->ParentWindow->ID : 0;
    node_settings.SelectedTabId = node->SelectedTabId;
    node_settings.SplitAxis = (signed char)(node->IsSplitNode() ? node->SplitAxis : ImGuiAxis_None);
    node_settings.Depth = (char)depth;
    node_settings.Flags = (node->LocalFlags & ImGuiDockNodeFlags_SavedFlagsMask_);
    node_settings.Pos = ImVec2ih(node->Pos);
    node_settings.Size = ImVec2ih(node->Size);
    node_settings.SizeRef = ImVec2ih(node->SizeRef);
    dc->NodesSettings.push_back(node_settings);
    if (node->ChildNodes[0])
        DockSettingsHandler_DockNodeToSettings(dc, node->ChildNodes[0], depth + 1);
    if (node->ChildNodes[1])
        DockSettingsHandler_DockNodeToSettings(dc, node->ChildNodes[1], depth + 1);
}